

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getPassThroughFragmentShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType sampler_type,
          string *out_fragment_shader_code)

{
  ostream *poVar1;
  uint uVar2;
  bool *pbVar3;
  char *pcVar4;
  stringstream stream;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0;
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  uVar2 = sampler_type - Int;
  if (uVar2 < 4) {
    pbVar3 = (bool *)(&DAT_017c5594 + *(int *)(&DAT_017c5594 + (ulong)uVar2 * 4));
    pcVar4 = &DAT_017c55a4 + *(int *)(&DAT_017c55a4 + (ulong)uVar2 * 4);
  }
  else {
    pcVar4 = "vec4 ";
    pbVar3 = fixed_sample_locations_values + 1;
  }
  poVar1 = std::operator<<(&local_1a0,"${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n");
  poVar1 = std::operator<<(poVar1,"precision highp float;\n");
  poVar1 = std::operator<<(poVar1,"/* Pass through fragment shader */");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(&local_1a0,pbVar3);
  poVar1 = std::operator<<(poVar1,"in ");
  poVar1 = std::operator<<(poVar1,pcVar4);
  poVar1 = std::operator<<(poVar1,"fs_in_color");
  poVar1 = std::operator<<(poVar1,";");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(&local_1a0);
  poVar1 = std::operator<<(&local_1a0,"layout(location = 0) ");
  poVar1 = std::operator<<(poVar1,"out ");
  poVar1 = std::operator<<(poVar1,pcVar4);
  poVar1 = std::operator<<(poVar1,"fs_out_color");
  poVar1 = std::operator<<(poVar1,";");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(&local_1a0);
  poVar1 = std::operator<<(&local_1a0,"void main()\n{\n    fs_out_color = fs_in_color;\n}\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_fragment_shader_code,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getPassThroughFragmentShaderCode(samplerType  sampler_type,
																	   std::string& out_fragment_shader_code)
{
	std::stringstream  stream;
	const glw::GLchar* color_type;
	const glw::GLchar* interpolation_type;
	const glw::GLchar* ignored_sampler_type;
	glw::GLuint		   ignored_n_components;
	bool			   ignored_is_shadow;

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, ignored_sampler_type, ignored_n_components,
				 ignored_is_shadow);

	/* Preamble */
	stream << shader_code_preamble << shader_precision << "/* Pass through fragment shader */" << std::endl;

	/* in vec4 fs_in_color */
	stream << interpolation_type << shader_input << color_type << fragment_shader_input << ";" << std::endl;

	stream << std::endl;

	/* layout(location = 0) out vec4 fs_out_color */
	stream << shader_layout << shader_output << color_type << fragment_shader_output << ";" << std::endl;

	stream << std::endl;

	/* Body */
	stream << fragment_shader_pass_through_body_code << std::endl;

	/* Store result */
	out_fragment_shader_code = stream.str();
}